

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkFinMiterCollect(Abc_Ntk_t *pNtk,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  undefined4 local_34;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCis_local;
  Vec_Int_t *vCos_local;
  Abc_Ntk_t *pNtk_local;
  
  Vec_IntClear(vCis);
  Vec_IntClear(vNodes);
  Abc_NtkIncrementTravId(pNtk);
  for (local_34 = 0; iVar1 = Vec_IntSize(vCos), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(vCos,local_34);
    pAVar2 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      pAVar2 = Abc_ObjFanin0(pAVar2);
      Abc_NtkFinMiterCollect_rec(pAVar2,vCis,vNodes);
    }
  }
  return;
}

Assistant:

void Abc_NtkFinMiterCollect( Abc_Ntk_t * pNtk, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pObj; int i;
    Vec_IntClear( vCis );
    Vec_IntClear( vNodes );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachObjVec( vCos, pNtk, pObj, i )
        Abc_NtkFinMiterCollect_rec( Abc_ObjFanin0(pObj), vCis, vNodes );
}